

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O2

void __thiscall MyCompiler::Token::Token(Token *this,SymbolType symbolType,string *value)

{
  this->symbolType = symbolType;
  std::__cxx11::string::string((string *)&this->value,(string *)value);
  return;
}

Assistant:

MyCompiler::Token::Token(MyCompiler::SymbolType symbolType, std::string value)
        : symbolType(symbolType), value(std::move(value))
{}